

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ieee.cc
# Opt level: O2

void TestDouble_AsDiyFp(void)

{
  undefined1 uVar1;
  int in_R9D;
  DiyFp DVar2;
  Double local_20;
  
  local_20.d64_ = 0x123456789abcdef;
  DVar2 = double_conversion::Double::AsDiyFp(&local_20);
  uVar1 = 0xf5;
  CheckEqualsHelper((char *)0x45,0xc1c1e3,(char *)0xfffffbdf,0xc1c1f5,(char *)(ulong)(uint)DVar2.e_,
                    in_R9D);
  CheckHelper((char *)0x47,0xc1c200,(char *)(ulong)(DVar2.f_ == 0x13456789abcdef),(bool)uVar1);
  local_20.d64_ = 1;
  DVar2 = double_conversion::Double::AsDiyFp(&local_20);
  uVar1 = 0xf5;
  CheckEqualsHelper((char *)0x4b,0xc1c245,(char *)0xfffffbce,0xc1c1f5,(char *)(ulong)(uint)DVar2.e_,
                    in_R9D);
  CheckHelper((char *)0x4d,0xc1c255,(char *)(ulong)(DVar2.f_ == 1),(bool)uVar1);
  local_20.d64_ = 0x7fefffffffffffff;
  DVar2 = double_conversion::Double::AsDiyFp(&local_20);
  uVar1 = 0xf5;
  CheckEqualsHelper((char *)0x51,0xc1c265,(char *)0x3cb,0xc1c1f5,(char *)(ulong)(uint)DVar2.e_,
                    in_R9D);
  CheckHelper((char *)0x52,0xc1c278,(char *)(ulong)(DVar2.f_ == 0x1fffffffffffff),(bool)uVar1);
  return;
}

Assistant:

TEST(Double_AsDiyFp) {
  uint64_t ordered = DOUBLE_CONVERSION_UINT64_2PART_C(0x01234567, 89ABCDEF);
  DiyFp diy_fp = Double(ordered).AsDiyFp();
  CHECK_EQ(0x12 - 0x3FF - 52, diy_fp.e());
  // The 52 mantissa bits, plus the implicit 1 in bit 52 as a UINT64.
  CHECK(DOUBLE_CONVERSION_UINT64_2PART_C(0x00134567, 89ABCDEF) == diy_fp.f());  // NOLINT

  uint64_t min_double64 = DOUBLE_CONVERSION_UINT64_2PART_C(0x00000000, 00000001);
  diy_fp = Double(min_double64).AsDiyFp();
  CHECK_EQ(-0x3FF - 52 + 1, diy_fp.e());
  // This is a denormal; so no hidden bit.
  CHECK(1 == diy_fp.f());  // NOLINT

  uint64_t max_double64 = DOUBLE_CONVERSION_UINT64_2PART_C(0x7fefffff, ffffffff);
  diy_fp = Double(max_double64).AsDiyFp();
  CHECK_EQ(0x7FE - 0x3FF - 52, diy_fp.e());
  CHECK(DOUBLE_CONVERSION_UINT64_2PART_C(0x001fffff, ffffffff) == diy_fp.f());  // NOLINT
}